

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho-corasick-lite.cpp
# Opt level: O1

void __thiscall Trie::Trie(Trie *this)

{
  trie_node_t *ptVar1;
  _Rb_tree_header *p_Var2;
  
  (this->lengthVect).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lengthVect).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->weightVect).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lengthVect).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->weightVect).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->weightVect).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ptVar1 = (trie_node_t *)operator_new(0x40);
  p_Var2 = &(ptVar1->nextMap)._M_t._M_impl.super__Rb_tree_header;
  (ptVar1->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (ptVar1->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (ptVar1->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (ptVar1->nextMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (ptVar1->nextMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ptVar1->search_clue = (trie_node_t *)0x0;
  ptVar1->infoIndex = -1;
  this->root = ptVar1;
  this->size = 0;
  return;
}

Assistant:

Trie::Trie()
{
	root = new trie_node_t;
	size = 0;
}